

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_rectangle_pro(rf_rec rec,rf_vec2 origin,float rotation,rf_color color)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  rf_render_batch *prVar5;
  long lVar6;
  rf_vertex_buffer *prVar7;
  rf_gfx_texcoord_data_type *prVar8;
  rf_context *prVar9;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  prVar9 = rf__ctx;
  if ((rf__ctx->field_0).tex_shapes.id == 0) {
    (rf__ctx->field_0).tex_shapes.id = (rf__ctx->field_0).default_texture_id;
    (prVar9->field_0).tex_shapes.width = 1;
    (prVar9->field_0).tex_shapes.height = 1;
    (prVar9->field_0).tex_shapes.mipmaps = 1;
    (prVar9->field_0).tex_shapes.format = RF_UNCOMPRESSED_R8G8B8A8;
    *(undefined4 *)&(prVar9->field_0).tex_shapes.valid = 0;
    (prVar9->field_0).rec_tex_shapes.x = 0.0;
    (prVar9->field_0).rec_tex_shapes.y = 0.0;
    (prVar9->field_0).rec_tex_shapes.width = 1.0;
    (prVar9->field_0).rec_tex_shapes.height = 1.0;
  }
  rf_gfx_enable_texture((prVar9->field_0).tex_shapes.id);
  rf_gfx_push_matrix();
  local_38 = rec.x;
  fStack_34 = rec.y;
  rf_gfx_translatef(local_38,fStack_34,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  local_58 = origin.x;
  fStack_54 = origin.y;
  rf_gfx_translatef(-local_58,-fStack_54,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = fVar1 / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  rf_gfx_vertex3f(0.0,0.0,prVar5->current_depth);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  fVar2 = (rf__ctx->field_0).rec_tex_shapes.height;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = (fVar1 + fVar2) / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  fStack_44 = rec.height;
  rf_gfx_vertex3f(0.0,fStack_44,prVar5->current_depth);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  fVar2 = (rf__ctx->field_0).rec_tex_shapes.height;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
       (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = (fVar1 + fVar2) / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  local_48 = rec.width;
  rf_gfx_vertex3f(local_48,fStack_44,prVar5->current_depth);
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.y;
  iVar3 = (rf__ctx->field_0).tex_shapes.height;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar7 = prVar5->vertex_buffers;
  prVar8 = prVar7[lVar6].texcoords;
  iVar4 = prVar7[lVar6].tc_counter;
  prVar8[(long)iVar4 * 2] =
       ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
       (float)(rf__ctx->field_0).tex_shapes.width;
  prVar8[iVar4 * 2 + 1] = fVar1 / (float)iVar3;
  prVar7[lVar6].tc_counter = prVar7[lVar6].tc_counter + 1;
  rf_gfx_vertex3f(local_48,0.0,prVar5->current_depth);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_rectangle_pro(rf_rec rec, rf_vec2 origin, float rotation, rf_color color)
{
    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_translatef(rec.x, rec.y, 0.0f);
    rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
    rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, 0.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, rec.height);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.width, rec.height);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.width, 0.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}